

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_rolemaskproxymodel.cpp
# Opt level: O0

void __thiscall tst_RoleMaskProxyModel::testInsertRow(tst_RoleMaskProxyModel *this)

{
  QObject *parent;
  uint uVar1;
  undefined4 uVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  undefined8 *puVar6;
  uint *puVar7;
  ModelTest *this_00;
  QModelIndex local_168;
  QVariant local_150;
  QModelIndex local_130;
  QVariant local_118;
  QModelIndex local_f8;
  QVariant local_e0;
  uint local_c0;
  undefined4 local_bc;
  int i_1;
  QVariant local_98;
  undefined1 local_78 [4];
  int i;
  QModelIndex proxyParent;
  int magicNumber;
  undefined1 local_50 [8];
  RoleMaskProxyModel proxyModel;
  undefined1 auStack_38 [8];
  QModelIndex parentIndex;
  int insertIndex;
  QAbstractItemModel *baseModel;
  tst_RoleMaskProxyModel *this_local;
  
  iVar5 = qMetaTypeId<QAbstractItemModel*>();
  puVar6 = (undefined8 *)QTest::qData("baseModel",iVar5);
  parent = (QObject *)*puVar6;
  if (parent != (QObject *)0x0) {
    iVar5 = qMetaTypeId<int>();
    puVar7 = (uint *)QTest::qData("insertIndex",iVar5);
    parentIndex.m._4_4_ = *puVar7;
    iVar5 = qMetaTypeId<QModelIndex>();
    puVar6 = (undefined8 *)QTest::qData("parentIndex",iVar5);
    parentIndex.i = puVar6[2];
    auStack_38 = (undefined1  [8])*puVar6;
    parentIndex._0_8_ = puVar6[1];
    RoleMaskProxyModel::RoleMaskProxyModel((RoleMaskProxyModel *)local_50,(QObject *)0x0);
    this_00 = (ModelTest *)operator_new(0x10);
    ModelTest::ModelTest(this_00,(QAbstractItemModel *)local_50,parent);
    RoleMaskProxyModel::addMaskedRole((int)local_50);
    RoleMaskProxyModel::setSourceModel((QAbstractItemModel *)local_50);
    proxyParent.m._0_4_ = 0xbfdd2;
    QIdentityProxyModel::mapFromSource((QModelIndex *)local_78);
    for (local_98.d._28_4_ = 0; uVar2 = local_98.d._28_4_,
        iVar5 = QIdentityProxyModel::rowCount((QModelIndex *)local_50), (int)uVar2 < iVar5;
        local_98.d._28_4_ = local_98.d._28_4_ + 1) {
      QIdentityProxyModel::index
                ((int)&local_98,(int)local_50,(QModelIndex *)(ulong)(uint)local_98.d._28_4_);
      QVariant::QVariant((QVariant *)&i_1,local_98.d._28_4_ + 0xbfdd2);
      bVar3 = RoleMaskProxyModel::setData((QModelIndex *)local_50,&local_98,(int)&i_1);
      bVar3 = QTest::qVerify((bool)(bVar3 & 1),
                             "proxyModel.setData(proxyModel.index(i, 0, proxyParent), magicNumber + i, Qt::UserRole)"
                             ,"",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                             ,0x2a7);
      QVariant::~QVariant((QVariant *)&i_1);
      if (((bVar3 ^ 0xff) & 1) != 0) {
        local_bc = 1;
        goto LAB_0011b4d7;
      }
    }
    bVar4 = QAbstractItemModel::insertRow
                      ((QAbstractItemModel *)parent,parentIndex.m._4_4_,(QModelIndex *)auStack_38);
    bVar3 = QTest::qVerify(bVar4,"baseModel->insertRow(insertIndex, parentIndex)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                           ,0x2a9);
    if ((bVar3 & 1) == 0) {
      local_bc = 1;
    }
    else {
      for (local_c0 = 0; uVar1 = local_c0,
          iVar5 = QIdentityProxyModel::rowCount((QModelIndex *)local_50), (int)uVar1 < iVar5;
          local_c0 = local_c0 + 1) {
        if (local_c0 == parentIndex.m._4_4_) {
          QIdentityProxyModel::index((int)&local_f8,(int)local_50,(QModelIndex *)(ulong)local_c0);
          QModelIndex::data(&local_e0,&local_f8,0x100);
          bVar4 = QVariant::isValid(&local_e0);
          bVar3 = QTest::qVerify((bool)(~bVar4 & 1),
                                 "!proxyModel.index(i, 0, proxyParent).data(Qt::UserRole).isValid()"
                                 ,"",
                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                 ,0x2ac);
          QVariant::~QVariant(&local_e0);
          if (((bVar3 ^ 0xff) & 1) != 0) {
            local_bc = 1;
            goto LAB_0011b4d7;
          }
        }
        else if ((int)parentIndex.m._4_4_ < (int)local_c0) {
          QIdentityProxyModel::index((int)&local_130,(int)local_50,(QModelIndex *)(ulong)local_c0);
          QModelIndex::data(&local_118,&local_130,0x100);
          iVar5 = QVariant::toInt((bool *)&local_118);
          bVar3 = QTest::qCompare(iVar5,local_c0 + 0xbfdd1,
                                  "proxyModel.index(i, 0, proxyParent).data(Qt::UserRole).toInt()",
                                  "magicNumber + i - 1",
                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                  ,0x2ae);
          QVariant::~QVariant(&local_118);
          if (((bVar3 ^ 0xff) & 1) != 0) {
            local_bc = 1;
            goto LAB_0011b4d7;
          }
        }
        else {
          QIdentityProxyModel::index((int)&local_168,(int)local_50,(QModelIndex *)(ulong)local_c0);
          QModelIndex::data(&local_150,&local_168,0x100);
          iVar5 = QVariant::toInt((bool *)&local_150);
          bVar3 = QTest::qCompare(iVar5,local_c0 + 0xbfdd2,
                                  "proxyModel.index(i, 0, proxyParent).data(Qt::UserRole).toInt()",
                                  "magicNumber + i",
                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                  ,0x2b0);
          QVariant::~QVariant(&local_150);
          if (((bVar3 ^ 0xff) & 1) != 0) {
            local_bc = 1;
            goto LAB_0011b4d7;
          }
        }
      }
      bVar4 = QAbstractItemModel::removeRow
                        ((QAbstractItemModel *)parent,parentIndex.m._4_4_,(QModelIndex *)auStack_38)
      ;
      bVar3 = QTest::qVerify(bVar4,"baseModel->removeRow(insertIndex, parentIndex)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                             ,0x2b2);
      if ((bVar3 & 1) == 0) {
        local_bc = 1;
      }
      else {
        QObject::deleteLater();
        local_bc = 0;
      }
    }
LAB_0011b4d7:
    RoleMaskProxyModel::~RoleMaskProxyModel((RoleMaskProxyModel *)local_50);
  }
  return;
}

Assistant:

void tst_RoleMaskProxyModel::testInsertRow()
{
    QFETCH(QAbstractItemModel *, baseModel);
    if (!baseModel)
        return;
    QFETCH(int, insertIndex);
    QFETCH(QModelIndex, parentIndex);
    RoleMaskProxyModel proxyModel;
    new ModelTest(&proxyModel, baseModel);
    proxyModel.addMaskedRole(Qt::UserRole);
    proxyModel.setSourceModel(baseModel);
    const int magicNumber = 785874;
    const QModelIndex proxyParent = proxyModel.mapFromSource(parentIndex);
    for (int i = 0; i < proxyModel.rowCount(proxyParent); ++i) {
        QVERIFY(proxyModel.setData(proxyModel.index(i, 0, proxyParent), magicNumber + i, Qt::UserRole));
    }
    QVERIFY(baseModel->insertRow(insertIndex, parentIndex));
    for (int i = 0; i < proxyModel.rowCount(proxyParent); ++i) {
        if (i == insertIndex)
            QVERIFY(!proxyModel.index(i, 0, proxyParent).data(Qt::UserRole).isValid());
        else if (i > insertIndex)
            QCOMPARE(proxyModel.index(i, 0, proxyParent).data(Qt::UserRole).toInt(), magicNumber + i - 1);
        else
            QCOMPARE(proxyModel.index(i, 0, proxyParent).data(Qt::UserRole).toInt(), magicNumber + i);
    }
    QVERIFY(baseModel->removeRow(insertIndex, parentIndex));
    baseModel->deleteLater();
}